

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffers.h
# Opt level: O1

void __thiscall
flatbuffers::FlatBufferBuilder::AddElement<float>
          (FlatBufferBuilder *this,voffset_t field,float e,float def)

{
  float *pfVar1;
  
  if (((e == def) && (!NAN(e) && !NAN(def))) && (this->force_defaults_ != true)) {
    return;
  }
  Align(this,4);
  pfVar1 = (float *)vector_downward::make_space(&this->buf_,4);
  *pfVar1 = e;
  TrackField(this,field,
             ((int)(this->buf_).reserved_ - *(int *)&(this->buf_).cur_) + *(int *)&(this->buf_).buf_
            );
  return;
}

Assistant:

void AddElement(voffset_t field, T e, T def) {
    // We don't serialize values equal to the default.
    if (e == def && !force_defaults_) return;
    auto off = PushElement(e);
    TrackField(field, off);
  }